

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdebug.h
# Opt level: O3

QDebug __thiscall
QtPrivate::printSequentialContainer<QList<QPlatformScreen*>>
          (QtPrivate *this,QDebug debug,char *which,QList<QPlatformScreen_*> *c)

{
  char *pcVar1;
  long lVar2;
  storage_type *psVar3;
  QPlatformScreen **ppQVar4;
  QPlatformScreen **ppQVar5;
  storage_type *psVar6;
  QTextStream *pQVar7;
  long in_FS_OFFSET;
  QByteArrayView QVar8;
  QByteArrayView QVar9;
  QDebugStateSaver saver;
  undefined1 *local_58;
  QString local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  QDebugStateSaver::QDebugStateSaver((QDebugStateSaver *)&local_58,(QDebug *)debug.stream);
  pQVar7 = *(QTextStream **)debug.stream;
  pQVar7[0x30] = (QTextStream)0x0;
  if (which == (char *)0x0) {
    psVar6 = (storage_type *)0x0;
  }
  else {
    psVar3 = (storage_type *)0xffffffffffffffff;
    do {
      psVar6 = psVar3 + 1;
      pcVar1 = which + 1 + (long)psVar3;
      psVar3 = psVar6;
    } while (*pcVar1 != '\0');
  }
  QVar8.m_data = psVar6;
  QVar8.m_size = (qsizetype)&local_50;
  QString::fromUtf8(QVar8);
  QTextStream::operator<<(pQVar7,&local_50);
  if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
    }
  }
  pQVar7 = *(QTextStream **)debug.stream;
  if (pQVar7[0x30] == (QTextStream)0x1) {
    QTextStream::operator<<(pQVar7,' ');
    pQVar7 = *(QTextStream **)debug.stream;
  }
  QTextStream::operator<<(pQVar7,'(');
  if ((*(QTextStream **)debug.stream)[0x30] == (QTextStream)0x1) {
    QTextStream::operator<<(*(QTextStream **)debug.stream,' ');
  }
  ppQVar5 = (c->d).ptr;
  lVar2 = (c->d).size;
  ppQVar4 = ppQVar5 + lVar2;
  if (lVar2 != 0) {
    QTextStream::operator<<(*(QTextStream **)debug.stream,*ppQVar5);
    if ((*(QTextStream **)debug.stream)[0x30] == (QTextStream)0x1) {
      QTextStream::operator<<(*(QTextStream **)debug.stream,' ');
    }
    ppQVar5 = ppQVar5 + 1;
  }
  if (ppQVar5 != ppQVar4) {
    do {
      pQVar7 = *(QTextStream **)debug.stream;
      QVar9.m_data = (storage_type *)0x2;
      QVar9.m_size = (qsizetype)&local_50;
      QString::fromUtf8(QVar9);
      QTextStream::operator<<(pQVar7,&local_50);
      if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
        }
      }
      pQVar7 = *(QTextStream **)debug.stream;
      if (pQVar7[0x30] == (QTextStream)0x1) {
        QTextStream::operator<<(pQVar7,' ');
        pQVar7 = *(QTextStream **)debug.stream;
      }
      QTextStream::operator<<(pQVar7,*ppQVar5);
      if ((*(QTextStream **)debug.stream)[0x30] == (QTextStream)0x1) {
        QTextStream::operator<<(*(QTextStream **)debug.stream,' ');
      }
      ppQVar5 = ppQVar5 + 1;
    } while (ppQVar5 != ppQVar4);
  }
  QTextStream::operator<<(*(QTextStream **)debug.stream,')');
  pQVar7 = *(QTextStream **)debug.stream;
  if (pQVar7[0x30] == (QTextStream)0x1) {
    QTextStream::operator<<(pQVar7,' ');
    pQVar7 = *(QTextStream **)debug.stream;
  }
  *(undefined8 *)debug.stream = 0;
  *(QTextStream **)this = pQVar7;
  QDebugStateSaver::~QDebugStateSaver((QDebugStateSaver *)&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return (QDebug)(Stream *)this;
}

Assistant:

inline QDebug printSequentialContainer(QDebug debug, const char *which, const SequentialContainer &c)
{
    const QDebugStateSaver saver(debug);
    debug.nospace() << which << '(';
    typename SequentialContainer::const_iterator it = c.begin(), end = c.end();
    if (it != end) {
        debug << *it;
        ++it;
    }
    while (it != end) {
        debug << ", " << *it;
        ++it;
    }
    debug << ')';
    return debug;
}